

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_emwin.cc
# Opt level: O2

bool __thiscall EMWINHandler::extractTimeStamp(EMWINHandler *this,string *text,timespec *ts)

{
  char *__s;
  char *pcVar1;
  time_t tVar2;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string local_70;
  tm tm;
  
  std::__cxx11::string::string((string *)&local_70,(string *)text);
  util::split(&parts,&local_70,'_');
  std::__cxx11::string::~string((string *)&local_70);
  if ((ulong)((long)parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x81) {
    bVar3 = false;
  }
  else {
    __s = parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
    pcVar1 = strptime(__s,"%Y%m%d%H%M%S",(tm *)&tm);
    bVar3 = pcVar1 == __s + 0xe;
    if (bVar3) {
      tVar2 = mktime((tm *)&tm);
      ts->tv_sec = tVar2;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  return bVar3;
}

Assistant:

bool EMWINHandler::extractTimeStamp(
    const std::string& text,
    struct timespec& ts) const {
  auto parts = split(text, '_');
  if (parts.size() < 5) {
    return false;
  }

  const char* buf = parts[4].c_str();
  const char* format = "%Y%m%d%H%M%S";
  struct tm tm;
  auto ptr = strptime(buf, format, &tm);

  // Only use time if strptime was successful
  if (ptr != (buf + 14)) {
    return false;
  }

  ts.tv_sec = mktime(&tm);
  return true;
}